

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<6UL>
mserialize::cx_strcat<1ul,2ul,1ul,1ul,1ul>
          (cx_string<1UL> *strings,cx_string<2UL> *strings_1,cx_string<1UL> *strings_2,
          cx_string<1UL> *strings_3,cx_string<1UL> *strings_4)

{
  cx_string<6UL> cVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  char buffer [7];
  size_t size [6];
  char *data [6];
  
  pcVar2 = buffer;
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  data[1] = strings->_data;
  data[2] = strings_1->_data;
  data[3] = strings_2->_data;
  data[4] = strings_3->_data;
  data[5] = strings_4->_data;
  lVar3 = 1;
  size[1] = 1;
  size[2] = 2;
  size[3] = 1;
  size[4] = 1;
  size[5] = 1;
  do {
    if (size[lVar3] != 0) {
      uVar4 = 0;
      do {
        pcVar2[uVar4] = data[lVar3][uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar4 < size[lVar3]);
      pcVar2 = pcVar2 + uVar4;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  cVar1._data[4] = buffer[4];
  cVar1._data[5] = buffer[5];
  cVar1._data[0] = buffer[0];
  cVar1._data[1] = buffer[1];
  cVar1._data[2] = buffer[2];
  cVar1._data[3] = buffer[3];
  cVar1._data[6] = '\0';
  return (cx_string<6UL>)cVar1._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}